

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O1

bool __thiscall
ElfRelocator::relocateFile(ElfRelocator *this,ElfRelocatorFile *file,int64_t *relocationAddress)

{
  string *str;
  byte bVar1;
  Elf32_Word EVar2;
  ElfFile *pEVar3;
  ElfSection *pEVar4;
  IElfRelocator *pIVar5;
  pointer pEVar6;
  element_type *peVar7;
  bool bVar8;
  undefined8 uVar9;
  pointer pbVar10;
  int64_t iVar11;
  uint uVar12;
  byte bVar13;
  int iVar14;
  ulong *puVar15;
  char *__s;
  mapped_type *pmVar16;
  byte bVar18;
  ElfFile *pEVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar19;
  string *error;
  size_t pos;
  long *plVar20;
  pointer pEVar21;
  pointer pEVar22;
  pointer pEVar23;
  uint uVar24;
  long lVar25;
  byte bVar26;
  ulong uVar27;
  ElfRelocator *pEVar28;
  uint uVar29;
  ElfRelocatorSection *entry;
  byte *pbVar30;
  pointer pEVar31;
  string_view text;
  string_view text_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  int symNum;
  vector<RelocationAction,_std::allocator<RelocationAction>_> relocationActions;
  Elf32_Sym sym;
  ByteArray sectionData;
  Elf32_Rela rela;
  shared_ptr<Label> label;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> relocationOffsets;
  bool local_1b4;
  undefined1 local_1a8 [32];
  pointer local_188;
  ElfRelocator *local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  pointer local_160;
  int local_158;
  undefined4 local_154;
  int64_t local_148;
  int local_140;
  uint local_13c;
  undefined1 local_138 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  ElfRelocatorFile *local_100;
  size_t local_f8;
  Elf32_Sym local_f0;
  undefined1 local_e0 [32];
  uint local_c0;
  undefined4 local_bc;
  undefined1 local_b8 [16];
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  pointer local_80;
  SymbolTable *local_78;
  pointer local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  local_60;
  
  pEVar3 = file->elf;
  local_148 = *relocationAddress;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pEVar21 = (file->sections).
            super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar31 = (file->sections).
            super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_188 = (pointer)relocationAddress;
  local_100 = file;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pEVar21 != pEVar31) {
    do {
      pEVar4 = pEVar21->section;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pEVar21->index;
      if ((pEVar4->header).sh_type == 8) {
        uVar24 = (pEVar4->header).sh_addr;
        puVar15 = (ulong *)std::
                           map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                           ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                         *)&local_60,(key_type *)&local_178);
        *puVar15 = (ulong)uVar24;
        relocationAddress = (int64_t *)local_188;
      }
      else {
        local_180 = (ElfRelocator *)(long)(int)(pEVar4->header).sh_size;
        uVar27 = (ulong)(pEVar4->header).sh_addralign;
        pEVar17 = ((pointer)relocationAddress)->elf;
        if ((long)pEVar17 % (long)uVar27 != 0) {
          do {
            pEVar17 = (ElfFile *)((pEVar17->fileHeader).e_ident + 1);
          } while ((long)pEVar17 % (long)uVar27 != 0);
          ((pointer)relocationAddress)->elf = pEVar17;
        }
        peVar7 = (pEVar21->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar7 != (element_type *)0x0) {
          peVar7->value = (int64_t)pEVar17;
        }
        pEVar17 = ((pointer)relocationAddress)->elf;
        pmVar16 = std::
                  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                  operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                              *)&local_60,(key_type *)&local_178);
        *pmVar16 = (mapped_type)pEVar17;
        ((pointer)relocationAddress)->elf =
             (ElfFile *)
             ((long)&(((_Vector_impl *)&(local_180->outputData).data_)->super__Vector_impl_data).
                     _M_start + (long)((pointer)relocationAddress)->elf);
      }
      pEVar21 = pEVar21 + 1;
    } while (pEVar21 != pEVar31);
  }
  iVar11 = local_148;
  local_f8 = (this->outputData).size_;
  ByteArray::reserveBytes
            (&this->outputData,(long)((pointer)relocationAddress)->elf - local_148,'\0');
  pEVar21 = (local_100->sections).
            super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar31 = (local_100->sections).
            super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pEVar22 = local_188;
  if (pEVar21 == pEVar31) {
    local_1b4 = true;
  }
  else {
    local_88 = &local_100->name;
    local_f8 = local_f8 - iVar11;
    bVar13 = 0;
    local_78 = &Global.symbolTable;
    local_80 = pEVar31;
    do {
      if ((pEVar21->section->header).sh_type != 8) {
        local_180 = (ElfRelocator *)pEVar21->index;
        pEVar28 = (ElfRelocator *)local_e0;
        ByteArray::ByteArray((ByteArray *)pEVar28,&pEVar21->section->data);
        pEVar4 = pEVar21->relSection;
        if (pEVar4 != (ElfSection *)0x0) {
          EVar2 = (pEVar4->header).sh_type;
          local_148 = CONCAT44(local_148._4_4_,EVar2);
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)CONCAT31((int3)(EVar2 >> 8),EVar2 == 4);
          local_138._0_8_ = (long *)0x0;
          local_138._8_8_ = (long *)0x0;
          local_138._16_8_ = 0;
          local_70 = pEVar21;
          if ((pEVar4->header).sh_size != 0) {
            local_140 = (uint)(EVar2 == 4) * 4 + 8;
            local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pEVar4->data;
            uVar24 = 0;
            do {
              args = local_68;
              loadRelocation(pEVar28,(Elf32_Rela *)(local_e0 + 0x1c),(int)local_148 == 4,
                             (ByteArray *)local_68,uVar24,
                             (uint)((pEVar3->fileHeader).e_ident[5] != '\x02'));
              uVar12 = local_c0;
              pos = (size_t)(int)local_e0._28_4_;
              pEVar28 = (ElfRelocator *)
                        (this->relocator)._M_t.
                        super___uniq_ptr_impl<IElfRelocator,_std::default_delete<IElfRelocator>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_IElfRelocator_*,_std::default_delete<IElfRelocator>_>
                        .super__Head_base<0UL,_IElfRelocator_*,_false>._M_head_impl;
              uVar29 = local_c0 & 0xff;
              iVar14 = (**(code **)((long)(pEVar28->outputData).data_ + 0x18))
                                 (pEVar28,(ulong)uVar29);
              if ((char)iVar14 == '\0') {
                local_13c = uVar12 >> 8;
                if (uVar12 < 0x100) {
                  bVar13 = 1;
                  pEVar28 = (ElfRelocator *)0x0;
                  Logger::queueError<int>((Logger *)0x0,0x191c32,(char *)&local_13c,(int *)args);
                }
                else {
                  ElfFile::getSymbol(pEVar3,&local_f0,(ulong)local_13c);
                  pbVar30 = (byte *)(ulong)local_f0.st_shndx;
                  iVar14 = ByteArray::getDoubleWord
                                     ((ByteArray *)local_e0,pos,
                                      (uint)((pEVar3->fileHeader).e_ident[5] != '\x02'));
                  local_178.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(local_178.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                         iVar14);
                  local_1a8._0_8_ = local_180;
                  pmVar16 = std::
                            map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                            ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                          *)&local_60,(key_type *)local_1a8);
                  local_178.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pos + *pmVar16);
                  local_178.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(local_bc,local_178.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_);
                  pIVar5 = (this->relocator)._M_t.
                           super___uniq_ptr_impl<IElfRelocator,_std::default_delete<IElfRelocator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_IElfRelocator_*,_std::default_delete<IElfRelocator>_>
                           .super__Head_base<0UL,_IElfRelocator_*,_false>._M_head_impl;
                  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ulong)(local_f0.st_info & 0xf);
                  (*pIVar5->_vptr_IElfRelocator[6])(pIVar5,&local_178,(ulong)local_f0.st_value);
                  if (local_f0.st_shndx == 0) {
                    if ((ulong)local_f0.st_name == 0) {
                      bVar13 = 1;
                      pEVar28 = (ElfRelocator *)0x1;
                      Logger::queueError<>(Error,"Symbol without a name");
                      goto LAB_0017473e;
                    }
                    __s = ElfFile::getStrTableString(pEVar3,(ulong)local_f0.st_name);
                    str = (string *)(local_138 + 0x18);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)str,__s,(allocator<char> *)local_b8);
                    toLowercase((string *)local_1a8,str);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._24_8_ != &local_110) {
                      operator_delete((void *)local_138._24_8_,local_110._M_allocated_capacity + 1);
                    }
                    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_a8,local_1a8._0_8_,
                               (pointer)((long)&(((_Vector_impl *)
                                                 &((ByteArray *)local_1a8._8_8_)->data_)->
                                                super__Vector_impl_data)._M_start + local_1a8._0_8_)
                              );
                    Identifier::Identifier((Identifier *)str,&local_a8);
                    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0xffffffff;
                    SymbolTable::getLabel
                              ((SymbolTable *)local_b8,(Identifier *)local_78,(int)str,-1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._24_8_ != &local_110) {
                      operator_delete((void *)local_138._24_8_,local_110._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                      operator_delete(local_a8._M_dataplus._M_p,
                                      (ulong)(local_a8.field_2._M_allocated_capacity + 1));
                    }
                    if ((pointer)local_b8._0_8_ == (pointer)0x0) {
                      Logger::queueError<std::__cxx11::string>
                                ((Logger *)0x1,0x191c60,local_1a8,args);
LAB_00174919:
                      bVar13 = 1;
                      bVar8 = false;
                    }
                    else {
                      if ((((string *)(local_b8._0_8_ + 0x38))->field_2)._M_local_buf[9] == '\0') {
                        args = local_88;
                        Logger::queueError<std::__cxx11::string,std::__cxx11::string>
                                  (Error,"Undefined external symbol %s in file %s",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1a8,local_88);
                        goto LAB_00174919;
                      }
                      local_178.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)(ulong)(uint)((string *)(local_b8._0_8_ + 0x38))->
                                                 _M_string_length;
                      bVar1 = (((string *)(local_b8._0_8_ + 0x38))->field_2)._M_local_buf[10];
                      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ulong)bVar1;
                      local_158 = 2 - (uint)bVar1;
                      local_154 = *(undefined4 *)
                                   ((long)&((string *)(local_b8._0_8_ + 0x38))->field_2 + 0xc);
                      bVar8 = true;
                    }
                    if ((pointer)local_b8._8_8_ != (pointer)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
                    }
                    pEVar28 = (ElfRelocator *)local_1a8._0_8_;
                    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                    }
                    if (!bVar8) goto LAB_0017473e;
                  }
                  else {
                    local_1a8._0_8_ = pbVar30;
                    pmVar16 = std::
                              map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                              ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                            *)&local_60,(key_type *)local_1a8);
                    local_178.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)((long)&(local_160->symbolName)._name._M_dataplus._M_p + *pmVar16)
                    ;
                  }
                  local_1a8._0_8_ = (ElfRelocator *)0x0;
                  local_1a8._8_8_ = (ElfRelocator *)0x0;
                  local_1a8._16_8_ = 0;
                  pIVar5 = (this->relocator)._M_t.
                           super___uniq_ptr_impl<IElfRelocator,_std::default_delete<IElfRelocator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_IElfRelocator_*,_std::default_delete<IElfRelocator>_>
                           .super__Head_base<0UL,_IElfRelocator_*,_false>._M_head_impl;
                  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138;
                  iVar14 = (*pIVar5->_vptr_IElfRelocator[4])
                                     (pIVar5,(ulong)uVar29,&local_178,args,local_1a8);
                  uVar9 = local_1a8._8_8_;
                  if ((char)iVar14 == '\0') {
                    bVar13 = 1;
                    for (pEVar28 = (ElfRelocator *)local_1a8._0_8_; pEVar28 != (ElfRelocator *)uVar9
                        ; pEVar28 = (ElfRelocator *)&pEVar28->files) {
                      text._M_str = (char *)args;
                      text._M_len = (size_t)(((_Vector_impl *)&(pEVar28->outputData).data_)->
                                            super__Vector_impl_data)._M_start;
                      Logger::queueError((Logger *)0x1,
                                         (ErrorType)(pointer)(pEVar28->outputData).size_,text);
                    }
                  }
                  pEVar28 = (ElfRelocator *)local_1a8;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)pEVar28);
                }
              }
LAB_0017473e:
              uVar24 = uVar24 + local_140;
            } while (uVar24 < (pEVar4->header).sh_size);
          }
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pIVar5 = (this->relocator)._M_t.
                   super___uniq_ptr_impl<IElfRelocator,_std::default_delete<IElfRelocator>_>._M_t.
                   super__Tuple_impl<0UL,_IElfRelocator_*,_std::default_delete<IElfRelocator>_>.
                   super__Head_base<0UL,_IElfRelocator_*,_false>._M_head_impl;
          iVar14 = (*pIVar5->_vptr_IElfRelocator[5])(pIVar5,local_138,&local_178);
          pbVar10 = local_178.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((char)iVar14 == '\0') {
            bVar13 = 1;
            for (pEVar22 = (pointer)local_178.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                pEVar22 != (pointer)pbVar10; pEVar22 = (pointer)&pEVar22->symbols) {
              text_00._M_str = (char *)args;
              text_00._M_len = (size_t)((_Alloc_hider *)&pEVar22->elf)->_M_p;
              Logger::queueError((Logger *)0x1,
                                 (ErrorType)
                                 *(size_type *)
                                  &(pEVar22->sections).
                                   super__Vector_base<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>
                                   ._M_impl.super__Vector_impl_data,text_00);
            }
          }
          uVar9 = local_138._8_8_;
          pEVar28 = (ElfRelocator *)local_1a8._0_8_;
          local_1a8._0_8_ = local_180;
          for (plVar20 = (long *)local_138._0_8_; local_180 = (ElfRelocator *)local_1a8._0_8_,
              plVar20 != (long *)uVar9; plVar20 = plVar20 + 2) {
            lVar25 = *plVar20;
            pmVar16 = std::
                      map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                      ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                    *)&local_60,(key_type *)local_1a8);
            lVar25 = lVar25 - *pmVar16;
            if (lVar25 + 3U < (ulong)local_e0._8_8_) {
              uVar24 = *(uint *)(plVar20 + 1);
              bVar18 = (byte)(uVar24 >> 8);
              bVar26 = (byte)(uVar24 >> 0x10);
              if ((pEVar3->fileHeader).e_ident[5] == '\x02') {
                *(byte *)(local_e0._0_8_ + lVar25) = (byte)(uVar24 >> 0x18);
                *(byte *)(local_e0._0_8_ + lVar25 + 1) = bVar26;
                *(byte *)(local_e0._0_8_ + lVar25 + 2) = bVar18;
              }
              else {
                *(byte *)(local_e0._0_8_ + lVar25) = (byte)uVar24;
                *(byte *)(local_e0._0_8_ + lVar25 + 1) = bVar18;
                *(byte *)(local_e0._0_8_ + lVar25 + 2) = bVar26;
                uVar24 = uVar24 >> 0x18;
              }
              *(byte *)(local_e0._0_8_ + lVar25 + 3U) = (byte)uVar24;
            }
            pEVar28 = (ElfRelocator *)local_1a8._0_8_;
            local_1a8._0_8_ = local_180;
          }
          local_1a8._0_8_ = pEVar28;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_178);
          pEVar21 = local_70;
          pEVar31 = local_80;
          if ((long *)local_138._0_8_ != (long *)0x0) {
            operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
            pEVar21 = local_70;
            pEVar31 = local_80;
          }
        }
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_180;
        pmVar16 = std::
                  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                  operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                              *)&local_60,(key_type *)&local_178);
        memcpy((this->outputData).data_ + *pmVar16 + local_f8,(void *)local_e0._0_8_,local_e0._8_8_)
        ;
        ByteArray::~ByteArray((ByteArray *)local_e0);
        pEVar22 = local_188;
      }
      pEVar21 = pEVar21 + 1;
    } while (pEVar21 != pEVar31);
    local_1b4 = (bool)(bVar13 ^ 1);
  }
  pEVar23 = (local_100->symbols).
            super__Vector_base<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar6 = (local_100->symbols).
           super__Vector_base<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar23 != pEVar6) {
    do {
      lVar25 = pEVar23->relocatedAddress;
      pEVar28 = (ElfRelocator *)pEVar23->section;
      if (pEVar28 == (ElfRelocator *)0xfff2) {
        pEVar3 = pEVar22->elf;
        lVar19 = (long)pEVar3 % pEVar23->relativeAddress;
        pEVar17 = pEVar3;
        while (lVar19 != 0) {
          pEVar17 = (ElfFile *)((pEVar17->fileHeader).e_ident + 1);
          pEVar22->elf = pEVar17;
          lVar19 = (long)pEVar17 % pEVar23->relativeAddress;
        }
        pEVar23->relocatedAddress = (int64_t)pEVar17;
        pEVar17 = (ElfFile *)((pEVar22->elf->fileHeader).e_ident + pEVar23->size);
        pEVar22->elf = pEVar17;
        ByteArray::reserveBytes(&this->outputData,(long)pEVar17 - (long)pEVar3,'\0');
        pEVar22 = local_188;
      }
      else if (pEVar28 == (ElfRelocator *)0xfff1) {
        pEVar23->relocatedAddress = pEVar23->relativeAddress;
      }
      else {
        lVar19 = pEVar23->relativeAddress;
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pEVar28;
        pmVar16 = std::
                  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                  operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                              *)&local_60,(key_type *)&local_178);
        pEVar23->relocatedAddress = lVar19 + *pmVar16;
        pEVar22 = local_188;
      }
      peVar7 = (pEVar23->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar7 != (element_type *)0x0) {
        peVar7->value = pEVar23->relocatedAddress;
      }
      if (lVar25 != pEVar23->relocatedAddress) {
        this->dataChanged = true;
      }
      pEVar23 = pEVar23 + 1;
    } while (pEVar23 != pEVar6);
  }
  std::
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  ::~_Rb_tree(&local_60);
  return local_1b4;
}

Assistant:

bool ElfRelocator::relocateFile(ElfRelocatorFile& file, int64_t& relocationAddress)
{
	ElfFile* elf = file.elf;
	int64_t start = relocationAddress;

	// calculate address for each section
	std::map<int64_t,int64_t> relocationOffsets;
	for (ElfRelocatorSection& entry: file.sections)
	{
		ElfSection* section = entry.section;
		size_t index = entry.index;
		int size = section->getSize();

		if (section->getType() == SHT_NOBITS) 
		{
			// these sections should not be relocated...
			relocationOffsets[index] = section->getAddress();

		} else {
			while (relocationAddress % section->getAlignment())
				relocationAddress++;

			if (entry.label != nullptr)
				entry.label->setValue(relocationAddress);

			relocationOffsets[index] = relocationAddress;
			relocationAddress += size;
		}
	}

	size_t dataStart = outputData.size();
	outputData.reserveBytes((size_t)(relocationAddress-start));

	// load sections
	bool error = false;
	for (ElfRelocatorSection& entry: file.sections)
	{
		ElfSection* section = entry.section;
		size_t index = entry.index;

		if (section->getType() == SHT_NOBITS)
		{
			// reserveBytes initialized the data to 0 already
			continue;
		}
		
		ByteArray sectionData = section->getData();

		// relocate if necessary
		ElfSection* relSection = entry.relSection;
		if (relSection != nullptr)
		{
			bool isRela = relSection->getType() == SHT_RELA;
			int structSize = isRela ? sizeof(Elf32_Rela) : sizeof(Elf32_Rel);

			std::vector<RelocationAction> relocationActions;
			for (unsigned int relOffset = 0; relOffset < relSection->getSize(); relOffset += structSize)
			{
				Elf32_Rela rela;
				loadRelocation(rela, isRela, relSection->getData(), relOffset, elf->getEndianness());
				int pos = rela.r_offset;

				if (relocator->isDummyRelocationType(rela.getType()))
					continue;

				int symNum = rela.getSymbolNum();
				if (symNum <= 0)
				{
					Logger::queueError(Logger::Warning, "Invalid symbol num %06X",symNum);
					error = true;
					continue;
				}

				Elf32_Sym sym;
				elf->getSymbol(sym, symNum);
				int symSection = sym.st_shndx;
				
				RelocationData relData;
				relData.opcode = sectionData.getDoubleWord(pos, elf->getEndianness());
				relData.opcodeOffset = pos+relocationOffsets[index];
				relData.addend = rela.r_addend;
				relocator->setSymbolAddress(relData,sym.st_value,sym.st_info & 0xF);

				// externs?
				if (sym.st_shndx == 0)
				{
					if (sym.st_name == 0)
					{
						Logger::queueError(Logger::Error, "Symbol without a name");
						error = true;
						continue;
					}

					std::string symName = toLowercase(elf->getStrTableString(sym.st_name));

					std::shared_ptr<Label> label = Global.symbolTable.getLabel(Identifier(symName),-1,-1);
					if (label == nullptr)
					{
						Logger::queueError(Logger::Error, "Invalid external symbol %s",symName);
						error = true;
						continue;
					}
					if (!label->isDefined())
					{
						Logger::queueError(Logger::Error, "Undefined external symbol %s in file %s",symName,file.name);
						error = true;
						continue;
					}
					
					relData.relocationBase = (unsigned int) label->getValue();
					relData.targetSymbolType = label->isData() ? STT_OBJECT : STT_FUNC;
					relData.targetSymbolInfo = label->getInfo();
				} else {
					relData.relocationBase = relocationOffsets[symSection]+relData.symbolAddress;
				}

				std::vector<std::string> errors;
				if (!relocator->relocateOpcode(rela.getType(), relData, relocationActions, errors))
				{
					for (const std::string& error : errors)
					{
						Logger::queueError(Logger::Error, error);
					}
					error = true;
					continue;
				}
			}

			// finish any dangling relocations
			std::vector<std::string> errors;
			if (!relocator->finish(relocationActions, errors))
			{
				for (const std::string& error : errors)
				{
					Logger::queueError(Logger::Error, error);
				}
				error = true;
			}

			// now actually write the relocated values
			for (const RelocationAction& action : relocationActions)
			{
				sectionData.replaceDoubleWord(action.offset-relocationOffsets[index], action.newValue, elf->getEndianness());
			}
		}

		size_t arrayStart = (size_t) (dataStart+relocationOffsets[index]-start);
		memcpy(outputData.data(arrayStart),sectionData.data(),sectionData.size());
	}
	
	// now update symbols
	for (ElfRelocatorSymbol& sym: file.symbols)
	{
		int64_t oldAddress = sym.relocatedAddress;

		switch (sym.section)
		{
		case SHN_ABS:		// address does not change
			sym.relocatedAddress = sym.relativeAddress;
			break;
		case SHN_COMMON:	// needs to be allocated. relativeAddress gives alignment constraint
			{
				int64_t start = relocationAddress;

				while (relocationAddress % sym.relativeAddress)
					relocationAddress++;

				sym.relocatedAddress = relocationAddress;
				relocationAddress += sym.size;
				outputData.reserveBytes((size_t)(relocationAddress-start));
			}
			break;
		default:			// normal relocated symbol
			sym.relocatedAddress = sym.relativeAddress+relocationOffsets[sym.section];
			break;
		}

		if (sym.label != nullptr)
			sym.label->setValue(sym.relocatedAddress);

		if (oldAddress != sym.relocatedAddress)
			dataChanged = true;
	}

	return !error;
}